

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O3

void av1_set_default_ref_deltas(int8_t *ref_deltas)

{
  ref_deltas[0] = '\x01';
  ref_deltas[1] = '\0';
  ref_deltas[2] = '\0';
  ref_deltas[3] = '\0';
  ref_deltas[4] = -1;
  ref_deltas[5] = '\0';
  ref_deltas[6] = -1;
  ref_deltas[7] = -1;
  return;
}

Assistant:

void av1_set_default_ref_deltas(int8_t *ref_deltas) {
  assert(ref_deltas != NULL);

  ref_deltas[INTRA_FRAME] = 1;
  ref_deltas[LAST_FRAME] = 0;
  ref_deltas[LAST2_FRAME] = ref_deltas[LAST_FRAME];
  ref_deltas[LAST3_FRAME] = ref_deltas[LAST_FRAME];
  ref_deltas[BWDREF_FRAME] = ref_deltas[LAST_FRAME];
  ref_deltas[GOLDEN_FRAME] = -1;
  ref_deltas[ALTREF2_FRAME] = -1;
  ref_deltas[ALTREF_FRAME] = -1;
}